

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzReadHeader(CSzArEx *p,CSzData *sd,ILookInStream *inStream,ISzAlloc *allocMain,
                 ISzAlloc *allocTemp)

{
  long in_RSI;
  ISzAlloc *in_R8;
  int __result__;
  CBuf tempBufs [8];
  SRes res;
  UInt32 numTempBufs;
  UInt32 i;
  ISzAlloc *in_stack_00000120;
  UInt32 *in_stack_00000128;
  CBuf *in_stack_00000130;
  ILookInStream *in_stack_00000138;
  CSzData *in_stack_00000140;
  CSzArEx *in_stack_00000148;
  ISzAlloc *in_stack_00000160;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  CBuf local_c8 [8];
  int local_3c;
  undefined4 local_38;
  uint local_34;
  ISzAlloc *local_30;
  long local_18;
  SRes local_4;
  
  local_38 = 0;
  local_30 = in_R8;
  local_18 = in_RSI;
  for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
    Buf_Init(local_c8 + local_34);
  }
  local_3c = SzReadHeader2(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                           in_stack_00000128,in_stack_00000120,in_stack_00000160);
  for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
    Buf_Free((CBuf *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),local_30);
  }
  if (local_3c == 0) {
    if (*(long *)(local_18 + 8) == 0) {
      local_4 = local_3c;
    }
    else {
      local_4 = 0xb;
    }
  }
  else {
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

static SRes SzReadHeader(
    CSzArEx *p,
    CSzData *sd,
    ILookInStream *inStream,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  UInt32 i;
  UInt32 numTempBufs = 0;
  SRes res;
  CBuf tempBufs[NUM_ADDITIONAL_STREAMS_MAX];

  for (i = 0; i < NUM_ADDITIONAL_STREAMS_MAX; i++)
    Buf_Init(tempBufs + i);
  
  res = SzReadHeader2(p, sd, inStream,
      tempBufs, &numTempBufs,
      allocMain, allocTemp);
  
  for (i = 0; i < NUM_ADDITIONAL_STREAMS_MAX; i++)
    Buf_Free(tempBufs + i, allocTemp);

  RINOK(res);

  if (sd->Size != 0)
    return SZ_ERROR_FAIL;

  return res;
}